

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xar_compression_init_encoder(archive_write *a)

{
  void *pvVar1;
  int local_1c;
  int r;
  xar_conflict *xar;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  switch(*(undefined4 *)((long)pvVar1 + 0x88)) {
  case 1:
    local_1c = compression_init_encoder_gzip
                         (&a->archive,(la_zstream_conflict *)((long)pvVar1 + 200),
                          *(int *)((long)pvVar1 + 0x8c),1);
    break;
  case 2:
    local_1c = compression_init_encoder_bzip2
                         (&a->archive,(la_zstream_conflict *)((long)pvVar1 + 200),
                          *(int *)((long)pvVar1 + 0x8c));
    break;
  case 3:
    local_1c = compression_init_encoder_lzma
                         (&a->archive,(la_zstream_conflict *)((long)pvVar1 + 200),
                          *(int *)((long)pvVar1 + 0x8c));
    break;
  case 4:
    local_1c = compression_init_encoder_xz
                         (&a->archive,(la_zstream_conflict *)((long)pvVar1 + 200),
                          *(int *)((long)pvVar1 + 0x8c),*(int *)((long)pvVar1 + 0x90));
    break;
  default:
    local_1c = 0;
  }
  if (local_1c == 0) {
    *(undefined8 *)((long)pvVar1 + 0xd8) = 0;
    *(long *)((long)pvVar1 + 0xe0) = (long)pvVar1 + 0x120;
    *(undefined8 *)((long)pvVar1 + 0xe8) = 0x10000;
    *(undefined8 *)((long)pvVar1 + 0xf0) = 0;
  }
  return local_1c;
}

Assistant:

static int
xar_compression_init_encoder(struct archive_write *a)
{
	struct xar *xar;
	int r;

	xar = (struct xar *)a->format_data;
	switch (xar->opt_compression) {
	case GZIP:
		r = compression_init_encoder_gzip(
		    &(a->archive), &(xar->stream),
		    xar->opt_compression_level, 1);
		break;
	case BZIP2:
		r = compression_init_encoder_bzip2(
		    &(a->archive), &(xar->stream),
		    xar->opt_compression_level);
		break;
	case LZMA:
		r = compression_init_encoder_lzma(
		    &(a->archive), &(xar->stream),
		    xar->opt_compression_level);
		break;
	case XZ:
		r = compression_init_encoder_xz(
		    &(a->archive), &(xar->stream),
		    xar->opt_compression_level, xar->opt_threads);
		break;
	default:
		r = ARCHIVE_OK;
		break;
	}
	if (r == ARCHIVE_OK) {
		xar->stream.total_in = 0;
		xar->stream.next_out = xar->wbuff;
		xar->stream.avail_out = sizeof(xar->wbuff);
		xar->stream.total_out = 0;
	}

	return (r);
}